

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fft.c
# Opt level: O1

kiss_fft_cfg kiss_fft_alloc(int nfft,int inverse_fft,void *mem,size_t *lenmem)

{
  size_t __size;
  kiss_fft_cfg pkVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined8 in_XMM2_Qb;
  undefined1 extraout_var [56];
  
  uVar3 = (ulong)(uint)nfft;
  __size = (long)nfft * 8 + 0x108;
  if (lenmem == (size_t *)0x0) {
    mem = malloc(__size);
  }
  else {
    if (mem == (void *)0x0) {
      mem = (kiss_fft_cfg)0x0;
    }
    else if (*lenmem < __size) {
      mem = (kiss_fft_cfg)0x0;
    }
    *lenmem = __size;
  }
  if ((kiss_fft_cfg)mem != (kiss_fft_cfg)0x0) {
    ((kiss_fft_cfg)mem)->nfft = nfft;
    ((kiss_fft_cfg)mem)->inverse = inverse_fft;
    if (0 < nfft) {
      uVar6 = 0;
      do {
        auVar13._0_8_ = ((double)(int)uVar6 * -6.283185307179586) / (double)nfft;
        auVar13._8_8_ = 0;
        bVar7 = ((kiss_fft_cfg)mem)->inverse == 0;
        auVar9._8_8_ = 0x8000000000000000;
        auVar9._0_8_ = 0x8000000000000000;
        auVar9 = vxorpd_avx512vl(auVar13,auVar9);
        dVar8 = (double)((ulong)bVar7 * (long)auVar13._0_8_ + (ulong)!bVar7 * auVar9._0_8_);
        dVar10 = cos(dVar8);
        ((kiss_fft_cfg)mem)->twiddles[uVar6].r = (float)dVar10;
        dVar8 = sin(dVar8);
        ((kiss_fft_cfg)mem)->twiddles[uVar6].i = (float)dVar8;
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
    auVar11._0_8_ = (double)nfft;
    auVar11._8_8_ = in_XMM2_Qb;
    if (auVar11._0_8_ < 0.0) {
      auVar12._0_8_ = sqrt(auVar11._0_8_);
      auVar12._8_56_ = extraout_var;
      auVar9 = auVar12._0_16_;
    }
    else {
      auVar9 = vsqrtsd_avx(auVar11,auVar11);
    }
    auVar9 = vroundsd_avx(auVar9,auVar9,9);
    pkVar1 = (kiss_fft_cfg)mem;
    iVar4 = 4;
    do {
      while (iVar2 = (int)uVar3, iVar2 % iVar4 != 0) {
        if (iVar4 == 4) {
          iVar5 = 2;
        }
        else if (iVar4 == 2) {
          iVar5 = 3;
        }
        else {
          iVar5 = iVar4 + 2;
        }
        iVar4 = iVar2;
        if ((double)iVar5 <= auVar9._0_8_) {
          iVar4 = iVar5;
        }
      }
      pkVar1->factors[0] = iVar4;
      iVar5 = (int)((long)iVar2 / (long)iVar4);
      uVar3 = (long)iVar2 / (long)iVar4 & 0xffffffff;
      pkVar1->factors[1] = iVar5;
      pkVar1 = (kiss_fft_cfg)pkVar1->factors;
    } while (1 < iVar5);
  }
  return (kiss_fft_cfg)mem;
}

Assistant:

kiss_fft_cfg kiss_fft_alloc(int nfft,int inverse_fft,void * mem,size_t * lenmem )
{
    kiss_fft_cfg st=NULL;
    size_t memneeded = sizeof(struct kiss_fft_state)
        + sizeof(kiss_fft_cpx)*(nfft-1); /* twiddle factors*/

    if ( lenmem==NULL ) {
        st = ( kiss_fft_cfg)KISS_FFT_MALLOC( memneeded );
    }else{
        if (mem != NULL && *lenmem >= memneeded)
            st = (kiss_fft_cfg)mem;
        *lenmem = memneeded;
    }
    if (st) {
        int i;
        st->nfft=nfft;
        st->inverse = inverse_fft;

        for (i=0;i<nfft;++i) {
            const double pi=3.141592653589793238462643383279502884197169399375105820974944;
            double phase = -2*pi*i / nfft;
            if (st->inverse)
                phase *= -1;
            kf_cexp(st->twiddles+i, phase );
        }

        kf_factor(nfft,st->factors);
    }
    return st;
}